

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_Writer.cpp
# Opt level: O3

void __thiscall OSTEI_Writer::PartitionWorkspace(OSTEI_Writer *this)

{
  QAM *pQVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  OSTEI_HRR_Algorithm_Base *pOVar5;
  _Rb_tree_node_base *p_Var6;
  OSTEI_VRR_Algorithm_Base *pOVar7;
  _Base_ptr p_Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  QAM am;
  string local_1b8;
  undefined1 local_198 [8];
  _Base_ptr p_Stack_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  undefined1 local_178 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_168;
  _Base_ptr p_Stack_160;
  _Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_> local_158;
  string local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  _Base_ptr p_Stack_100;
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  _Alloc_hider local_c8;
  char local_b8 [16];
  undefined8 local_a8;
  _Base_ptr p_Stack_a0;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  _Base_ptr p_Stack_60;
  undefined1 *local_58 [2];
  undefined1 local_48 [24];
  
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                      indent1_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"// partition workspace\n",0x17);
  pOVar5 = OSTEI_HRR_Writer::Algo((this->super_OSTEI_Writer_Base).hrr_writer_);
  OSTEI_HRR_Algorithm_Base::TopAM((QAMSet *)&local_158,pOVar5);
  p_Var6 = local_158._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_158._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_158._M_impl.super__Rb_tree_header) {
    do {
      pQVar1 = (QAM *)(p_Var6 + 1);
      bVar2 = QAM::operator==(pQVar1,&(((this->super_OSTEI_Writer_Base).info_)->
                                      super_GeneratorInfoBase).finalam_);
      if (!bVar2) {
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                            indent1_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"double * const ",0xf);
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"");
        ArrVarName((string *)local_198,pQVar1,&local_1b8);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)local_198,(long)p_Stack_190);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4," = work + (SIMINT_NSHELL_SIMD * ",0x20);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,");\n",3);
        if (local_198 != (undefined1  [8])&local_188) {
          operator_delete((void *)local_198);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p);
        }
        local_a8 = *(undefined8 *)(pQVar1->qam)._M_elems;
        p_Stack_a0 = p_Var6[1]._M_parent;
        local_98[0] = local_88;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_98,p_Var6[1]._M_left,
                   (long)&(p_Var6[1]._M_left)->_M_color + (long)&(p_Var6[1]._M_right)->_M_color);
        if (local_98[0] != local_88) {
          operator_delete(local_98[0]);
        }
      }
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != &local_158._M_impl.super__Rb_tree_header);
  }
  std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::~_Rb_tree
            (&local_158);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                      indent1_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "SIMINT_DBLTYPE * const primwork = (SIMINT_DBLTYPE *)(work + SIMINT_NSHELL_SIMD*",0x4f)
  ;
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,");\n",3);
  pOVar7 = OSTEI_VRR_Writer::Algo((this->super_OSTEI_Writer_Base).vrr_writer_);
  OSTEI_VRR_Algorithm_Base::GetAllAM((QAMSet *)&local_158,pOVar7);
  if ((_Rb_tree_header *)local_158._M_impl.super__Rb_tree_header._M_header._M_left ==
      &local_158._M_impl.super__Rb_tree_header) {
    local_168 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
  }
  else {
    local_168 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
    p_Var8 = local_158._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                          indent1_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"SIMINT_DBLTYPE * const restrict ",0x20);
      pQVar1 = (QAM *)(p_Var8 + 1);
      p_Stack_190 = (_Base_ptr)0x4;
      local_188._M_allocated_capacity._0_5_ = 0x4d495250;
      local_198 = (undefined1  [8])&local_188;
      ArrVarName(&local_1b8,pQVar1,(string *)local_198);
      if (local_198 != (undefined1  [8])&local_188) {
        operator_delete((void *)local_198);
      }
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," = primwork + ",0xe);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,";\n",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p);
      }
      pOVar7 = OSTEI_VRR_Writer::Algo((this->super_OSTEI_Writer_Base).vrr_writer_);
      local_d8._0_8_ = *(undefined8 *)(pQVar1->qam)._M_elems;
      local_d8._8_8_ = p_Var8[1]._M_parent;
      local_c8._M_p = local_b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,p_Var8[1]._M_left,
                 (long)&(p_Var8[1]._M_left)->_M_color + (long)&(p_Var8[1]._M_right)->_M_color);
      iVar3 = OSTEI_VRR_Algorithm_Base::GetMReq(pOVar7,(QAM *)local_d8);
      local_68 = *(undefined8 *)(pQVar1->qam)._M_elems;
      p_Stack_60 = p_Var8[1]._M_parent;
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,p_Var8[1]._M_left,
                 (long)&(p_Var8[1]._M_left)->_M_color + (long)&(p_Var8[1]._M_right)->_M_color);
      local_78 = local_68;
      uStack_70 = p_Stack_60;
      if (local_58[0] != local_48) {
        operator_delete(local_58[0]);
      }
      if (local_c8._M_p != local_b8) {
        operator_delete(local_c8._M_p);
      }
      auVar9._0_4_ = (int)local_78 + 2;
      auVar9._4_4_ = local_78._4_4_ + 2;
      auVar9._8_4_ = (int)uStack_70 + 2;
      auVar9._12_4_ = uStack_70._4_4_ + 2;
      auVar10._4_4_ = local_78._4_4_ + 1;
      auVar10._12_4_ = uStack_70._4_4_ + 1;
      auVar10._0_4_ = auVar10._4_4_;
      auVar10._8_4_ = auVar10._12_4_;
      local_168 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_168->_M_local_buf +
                     (int)((~((int)uStack_70 >> 0x1f) &
                           (uint)((auVar9._8_8_ & 0xffffffff) * (ulong)((int)uStack_70 + 1)) >> 1) *
                           (~((int)local_78 >> 0x1f) &
                           (uint)(auVar9._0_4_ * ((int)local_78 + 1)) >> 1) *
                           (~(local_78._4_4_ >> 0x1f) & (uint)(auVar10._4_4_ * auVar9._4_4_) >> 1) *
                           (~(uStack_70._4_4_ >> 0x1f) &
                           (uint)((auVar10._8_8_ & 0xffffffff) * (ulong)auVar9._12_4_) >> 1) *
                          (iVar3 + 1)));
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != &local_158._M_impl.super__Rb_tree_header);
  }
  std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::~_Rb_tree
            (&local_158);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                      indent1_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"double * const hrrwork = (double *)(primwork + ",0x2f);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,");\n",3);
  pOVar5 = OSTEI_HRR_Writer::Algo((this->super_OSTEI_Writer_Base).hrr_writer_);
  OSTEI_HRR_Algorithm_Base::GetIntermediates((QAMSet *)&local_158,pOVar5);
  if ((_Rb_tree_header *)local_158._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_158._M_impl.super__Rb_tree_header) {
    p_Var8 = local_158._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_198 = *(undefined1 (*) [8])(p_Var8 + 1);
      p_Stack_190 = p_Var8[1]._M_parent;
      local_188._M_allocated_capacity = (size_type)local_178;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_188,p_Var8[1]._M_left,
                 (long)&(p_Var8[1]._M_left)->_M_color + (long)&(p_Var8[1]._M_right)->_M_color);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                          indent1_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"double * const ",0xf);
      local_1b8.field_2._M_local_buf[2] = 'R';
      local_1b8.field_2._M_allocated_capacity._0_2_ = 0x5248;
      local_1b8._M_string_length = 3;
      local_1b8.field_2._M_local_buf[3] = '\0';
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      ArrVarName(&local_128,(QAM *)local_198,&local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p);
      }
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_128._M_dataplus._M_p,local_128._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," = hrrwork + ",0xd);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,";\n",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      local_108 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198;
      p_Stack_100 = p_Stack_190;
      local_f8[0] = local_e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_f8,local_188._M_allocated_capacity,
                 (undefined1 *)(local_188._8_8_ + local_188._M_allocated_capacity));
      local_168 = local_108;
      p_Stack_160 = p_Stack_100;
      if (local_f8[0] != local_e8) {
        operator_delete(local_f8[0]);
      }
      if ((undefined1 *)local_188._M_allocated_capacity != local_178) {
        operator_delete((void *)local_188._M_allocated_capacity);
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != &local_158._M_impl.super__Rb_tree_header);
  }
  std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::~_Rb_tree
            (&local_158);
  std::__ostream_insert<char,std::char_traits<char>>((this->super_OSTEI_Writer_Base).os_,"\n\n",2);
  return;
}

Assistant:

void OSTEI_Writer::PartitionWorkspace(void) const
{
    os_ << indent1 << "// partition workspace\n";
    size_t ptidx = 0;

    ////////////////////////////////////////
    // For HRR batched quartets
    ////////////////////////////////////////
    for(const auto & it : hrr_writer_.Algo().TopAM())
    {
        if(!info_.IsFinalAM(it))
        {
            os_ << indent1 << "double * const " << ArrVarName(it) << " = work + (SIMINT_NSHELL_SIMD * " << ptidx << ");\n";
            ptidx += NCART(it);
        }
    }


    ////////////////////////////////////////
    // For VRR
    ////////////////////////////////////////
    // Note: vrr_writer handles the prim arrays for s_s_s_s
    //       so we always want to run this

    if(info_.UseStack())
    {
        for(const auto & am : vrr_writer_.Algo().GetAllAM())
        {
            os_ << indent1 << "SIMINT_DBLTYPE " << PrimVarName(am)
                << "[" << (vrr_writer_.Algo().GetMReq(am)+1) << " * "
                << NCART(am) << "] SIMINT_ALIGN_ARRAY_DBL;\n";
        }
    }
    else
    {
        os_ << indent1 << "SIMINT_DBLTYPE * const primwork = (SIMINT_DBLTYPE *)(work + SIMINT_NSHELL_SIMD*" << ptidx << ");\n";
        ptidx = 0;

        for(const auto & am : vrr_writer_.Algo().GetAllAM())
        {
            // add +1 fromm required m values to account for 0
            os_ << indent1 << "SIMINT_DBLTYPE * const restrict " << PrimVarName(am)
                << " = primwork + " << ptidx << ";\n";

            ptidx += (vrr_writer_.Algo().GetMReq(am)+1) * NCART(am);
        }
    }

    /////////////////////
    // HRR Intermediates

    // A temporary is needed even for the "final am" if we are doing derivatives, since
    // it will actually be an intermediate
    if(info_.UseStack())
    {
        for(auto am : hrr_writer_.Algo().GetIntermediates())
            os_ << indent1 << "double " << HRRVarName(am) << "[" << NCART(am) << "];\n";
    }
    else
    {
        os_ << indent1 << "double * const hrrwork = (double *)(primwork + " << ptidx << ");\n";
        ptidx = 0;
        for(auto am : hrr_writer_.Algo().GetIntermediates())
        {
            os_ << indent1 << "double * const " << HRRVarName(am) << " = hrrwork + " << ptidx << ";\n";
            ptidx += NCART(am);
        }
    }

    os_ << "\n\n";
}